

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_extension_instances
               (lyout *out,int level,lys_module *module,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
               lys_ext_instance **ext,uint count)

{
  byte bVar1;
  ushort uVar2;
  lys_ext *plVar3;
  undefined8 uVar4;
  long lVar5;
  int iVar6;
  lys_ext_instance **pplVar7;
  int iVar8;
  LY_STMT LVar9;
  uint ext_size;
  lys_module *plVar10;
  lys_module *plVar11;
  long *plVar12;
  lys_ext_instance *plVar13;
  ulong uVar14;
  uint8_t substmt_index_00;
  long lVar15;
  long *plVar16;
  lys_ext_instance_complex *plVar17;
  lys_restr *restr;
  LYEXT_SUBSTMT LVar18;
  lyout *plVar19;
  undefined4 in_register_00000034;
  char **ppcVar20;
  lys_ext_instance **pplVar21;
  undefined7 in_register_00000081;
  char *pcVar22;
  char *pcVar23;
  uint uVar24;
  long lVar25;
  uint8_t *puVar26;
  lys_node *node;
  uint16_t val1;
  uint16_t val2;
  lyext_substmt *local_b8;
  long local_b0;
  char **local_a8;
  char *local_a0;
  uint local_94;
  uint local_90;
  LYEXT_SUBSTMT local_8c;
  long *local_88;
  undefined8 local_80;
  lys_ext *local_78;
  long *local_70;
  uint local_64;
  int local_60;
  int local_5c;
  lys_ext_instance **pplStack_58;
  int content2;
  lys_module *local_50;
  ulong local_48;
  lyout *local_40;
  int local_38;
  int local_34;
  int content;
  
  local_80 = CONCAT44(in_register_00000034,level);
  local_64 = (uint)CONCAT71(in_register_00000081,substmt_index);
  uVar14 = CONCAT71(in_register_00000081,substmt_index) & 0xffffffff;
  local_a8 = &module->prefix;
  local_94 = level * 2;
  local_90 = level * 2 + 2;
  local_34 = level + 1;
  local_60 = level + 2;
  local_48 = 0;
  pcVar22 = (char *)0x0;
  local_50 = module;
  local_40 = out;
LAB_00181d15:
  if (local_48 == count) {
    return;
  }
  plVar13 = ext[local_48];
  if ((((plVar13->flags & 1) == 0) && ((uint)plVar13->insubstmt == substmt)) &&
     (plVar13->insubstmt_index == (uint8_t)uVar14)) {
    plVar10 = plVar13->def->module;
    if (plVar10 == *(local_50->ctx->models).list) {
      pcVar23 = plVar13->arg_value;
      iVar8 = strcmp(pcVar23,"operation");
      if (((iVar8 == 0) || (iVar8 = strcmp(pcVar23,"select"), iVar8 == 0)) ||
         (iVar8 = strcmp(pcVar23,"type"), iVar8 == 0)) {
        uVar14 = (ulong)local_64;
        goto LAB_00183465;
      }
    }
    plVar11 = local_50;
    plVar10 = lys_main_module(plVar10);
    plVar11 = lys_main_module(plVar11);
    plVar19 = local_40;
    ppcVar20 = local_a8;
    if (plVar10 != plVar11) {
      lVar15 = 0x30;
      lVar25 = 0;
      do {
        if ((ulong)local_50->imp_size * 0x38 + lVar15 == 0x30) goto LAB_00181e1c;
        lVar15 = lVar15 + -0x38;
        lVar5 = lVar25 + -0x10;
        lVar25 = lVar25 + 0x38;
      } while (plVar10 != *(lys_module **)(local_50->imp->rev + lVar5));
      ppcVar20 = (char **)((long)local_50->imp - lVar15);
    }
    pcVar22 = *ppcVar20;
LAB_00181e1c:
    if (pcVar22 == (char *)0x0) {
      __assert_fail("prefix",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_yin.c"
                    ,0x7c5,
                    "void yin_print_extension_instances(struct lyout *, int, const struct lys_module *, LYEXT_SUBSTMT, uint8_t, struct lys_ext_instance **, unsigned int)"
                   );
    }
    local_38 = 0;
    plVar3 = ext[local_48]->def;
    pcVar23 = ext[local_48]->arg_value;
    if (pcVar23 == (char *)0x0) {
      ly_print(local_40,"%*s<%s:%s",(ulong)local_94,"",pcVar22,plVar3->name);
    }
    else if ((plVar3->flags & 1) == 0) {
      yin_print_open(local_40,(int)local_80,pcVar22,plVar3->name,plVar3->argument,pcVar23,0);
    }
    else {
      local_38 = 1;
      yin_print_open(local_40,(int)local_80,pcVar22,plVar3->name,(char *)0x0,(char *)0x0,1);
      uVar14 = local_48;
      ly_print(plVar19,"%*s<%s:%s>",(ulong)local_90,"",pcVar22,ext[local_48]->def->argument);
      lyxml_dump_text(plVar19,ext[uVar14]->arg_value,LYXML_DATA_ELEM);
      ly_print(plVar19,"</%s:%s>\n",pcVar22);
    }
    plVar19 = local_40;
    uVar14 = local_48;
    plVar13 = ext[local_48];
    if (plVar13->ext_size != '\0') {
      yin_print_close_parent(local_40,&local_38);
      yin_print_extension_instances
                (plVar19,local_34,local_50,LYEXT_SUBSTMT_SELF,'\0',ext[uVar14]->ext,
                 (uint)ext[uVar14]->ext_size);
      plVar13 = ext[uVar14];
    }
    if (plVar13->ext_type == '\x01') {
      local_78 = plVar13[1].def;
      uVar14 = (ulong)local_64;
      if (local_78 != (lys_ext *)0x0) {
        local_b0 = 0;
        local_a0 = pcVar22;
        local_8c = substmt;
        pplStack_58 = ext;
        do {
          plVar19 = local_40;
          pplVar21 = pplStack_58;
          LVar18 = *(LYEXT_SUBSTMT *)(local_78->padding + local_b0 * 0x18 + -0x1b);
          if (0x37 < (uint)LVar18) goto switchD_00181fd8_caseD_13;
          puVar26 = local_78->padding + local_b0 * 0x18 + -0x1b;
          switch(LVar18) {
          case LYEXT_SUBSTMT_SELF:
            goto switchD_00181fd8_caseD_0;
          case LYEXT_SUBSTMT_ARGUMENT:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_ARGUMENT,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (*plVar12 != 0)) {
              yin_print_close_parent(local_40,&local_38);
              local_88 = plVar12;
              if (*(uint *)&local_78->ref < 2) {
                local_5c = 0;
                yin_print_open(plVar19,local_34,(char *)0x0,"argument","name",(char *)*plVar12,0);
                uVar14 = local_48;
                pplVar21 = pplStack_58;
                iVar6 = local_60;
                iVar8 = -1;
                while (iVar8 = lys_ext_iter(pplVar21[uVar14]->ext,pplVar21[uVar14]->ext_size,
                                            (char)iVar8 + '\x01',LYEXT_SUBSTMT_ARGUMENT),
                      iVar8 != -1) {
                  yin_print_close_parent(plVar19,&local_5c);
                  yin_print_extension_instances
                            (plVar19,iVar6,local_50,LYEXT_SUBSTMT_ARGUMENT,'\0',
                             pplVar21[uVar14]->ext + iVar8,1);
                }
                if (((char)local_88[1] == '\x01') ||
                   (iVar8 = lys_ext_iter(pplVar21[local_48]->ext,pplVar21[local_48]->ext_size,'\0',
                                         LYEXT_SUBSTMT_YINELEM), iVar8 != -1)) {
                  yin_print_close_parent(plVar19,&local_5c);
                  pcVar22 = "false";
                  if ((char)local_88[1] == '\x01') {
                    pcVar22 = "true";
                  }
                  yin_print_substmt(plVar19,iVar6,LYEXT_SUBSTMT_YINELEM,'\0',pcVar22,local_50,
                                    pplVar21[local_48]->ext,(uint)pplVar21[local_48]->ext_size);
                }
                pcVar22 = "argument";
                iVar8 = local_5c;
LAB_00183359:
                yin_print_close(plVar19,local_34,(char *)0x0,pcVar22,iVar8);
              }
              else {
                plVar16 = (long *)0x0;
                while (pcVar22 = *(char **)(*plVar12 + (long)plVar16 * 8), pcVar22 != (char *)0x0) {
                  local_5c = 0;
                  local_70 = plVar16;
                  yin_print_open(local_40,local_34,(char *)0x0,"argument","name",pcVar22,0);
                  pplVar21 = pplStack_58;
                  iVar8 = -1;
                  uVar14 = local_48;
                  while( true ) {
                    iVar8 = lys_ext_iter(pplVar21[uVar14]->ext,pplVar21[uVar14]->ext_size,
                                         (char)iVar8 + '\x01',LYEXT_SUBSTMT_ARGUMENT);
                    plVar19 = local_40;
                    plVar16 = local_70;
                    plVar12 = local_88;
                    substmt_index_00 = (uint8_t)local_70;
                    if (iVar8 == -1) break;
                    if (local_70 == (long *)(ulong)pplVar21[uVar14]->ext[iVar8]->insubstmt_index) {
                      yin_print_close_parent(local_40,&local_5c);
                      uVar14 = local_48;
                      yin_print_extension_instances
                                (plVar19,local_60,local_50,LYEXT_SUBSTMT_ARGUMENT,substmt_index_00,
                                 pplVar21[local_48]->ext + iVar8,1);
                    }
                  }
                  if (*(char *)(local_88[1] + (long)local_70) == '\x01') {
                    yin_print_close_parent(local_40,&local_5c);
                    pcVar22 = "false";
                    if (*(char *)(plVar12[1] + (long)plVar16) == '\x01') {
                      pcVar22 = "true";
                    }
                    uVar24 = (uint)pplStack_58[local_48]->ext_size;
                    pplVar21 = pplStack_58[local_48]->ext;
                  }
                  else {
                    plVar13 = pplStack_58[uVar14];
                    pplVar21 = plVar13->ext;
                    iVar8 = -1;
                    do {
                      iVar8 = lys_ext_iter(pplVar21,plVar13->ext_size,(char)iVar8 + '\x01',
                                           LYEXT_SUBSTMT_YINELEM);
                      plVar19 = local_40;
                      if (iVar8 == -1) goto LAB_0018275b;
                      plVar13 = pplStack_58[uVar14];
                      pplVar21 = plVar13->ext;
                    } while (local_70 != (long *)(ulong)pplVar21[iVar8]->insubstmt_index);
                    yin_print_close_parent(local_40,&local_5c);
                    pcVar22 = "false";
                    if (*(char *)(plVar12[1] + (long)local_70) == '\x01') {
                      pcVar22 = "true";
                    }
                    pplVar21 = pplStack_58[local_48]->ext + iVar8;
                    uVar24 = (uint)pplStack_58[local_48]->ext_size - iVar8;
                  }
                  yin_print_substmt(plVar19,local_60,LYEXT_SUBSTMT_YINELEM,substmt_index_00,pcVar22,
                                    local_50,pplVar21,uVar24);
LAB_0018275b:
                  yin_print_close(local_40,local_34,(char *)0x0,"argument",local_5c);
                  plVar16 = (long *)((long)local_70 + 1);
                }
              }
            }
            break;
          default:
            plVar17 = (lys_ext_instance_complex *)pplStack_58[local_48];
            plVar12 = (long *)lys_ext_complex_get_substmt(LVar18,plVar17,&local_b8);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (lVar15 = *plVar12, lVar15 != 0)) {
              if (local_b8->cardinality < LY_STMT_CARD_SOME) {
                yin_print_close_parent(local_40,&local_38);
                pcVar22 = (char *)*plVar12;
                bVar1 = plVar17->ext_size;
                pplVar21 = plVar17->ext;
                goto LAB_00182105;
              }
              for (lVar25 = 0; plVar19 = local_40, *(long *)(lVar15 + lVar25 * 8) != 0;
                  lVar25 = lVar25 + 1) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_substmt(plVar19,local_34,LVar18,(uint8_t)lVar25,
                                  *(char **)(lVar15 + lVar25 * 8),local_50,plVar17->ext,
                                  (uint)plVar17->ext_size);
              }
            }
            break;
          case LYEXT_SUBSTMT_BELONGSTO:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_BELONGSTO,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (lVar15 = *plVar12, lVar15 != 0)) {
              local_70 = plVar12;
              if (*(uint *)&local_78->ref < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_open(plVar19,local_34,(char *)0x0,"belongs-to","module",(char *)*plVar12,1
                              );
                uVar14 = local_48;
                pplVar21 = pplStack_58;
                iVar6 = local_60;
                iVar8 = -1;
                while (iVar8 = lys_ext_iter(pplVar21[uVar14]->ext,pplVar21[uVar14]->ext_size,
                                            (char)iVar8 + '\x01',LYEXT_SUBSTMT_BELONGSTO),
                      iVar8 != -1) {
                  yin_print_extension_instances
                            (plVar19,iVar6,local_50,LYEXT_SUBSTMT_BELONGSTO,'\0',
                             pplVar21[uVar14]->ext + iVar8,1);
                }
                yin_print_substmt(plVar19,iVar6,LYEXT_SUBSTMT_PREFIX,'\0',(char *)local_70[1],
                                  local_50,pplVar21[uVar14]->ext,(uint)pplVar21[uVar14]->ext_size);
                pcVar22 = "belongs-to";
                iVar8 = 1;
                goto LAB_00183359;
              }
              lVar25 = 0;
              while (plVar19 = local_40, *(long *)(lVar15 + lVar25 * 8) != 0) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_open(plVar19,local_34,(char *)0x0,"belongs-to","module",
                               *(char **)(*plVar12 + lVar25 * 8),1);
                uVar14 = local_48;
                pplVar21 = pplStack_58;
                iVar6 = local_60;
                iVar8 = -1;
                while( true ) {
                  iVar8 = lys_ext_iter(pplVar21[uVar14]->ext,pplVar21[uVar14]->ext_size,
                                       (char)iVar8 + '\x01',LYEXT_SUBSTMT_BELONGSTO);
                  plVar19 = local_40;
                  plVar12 = local_70;
                  if (iVar8 == -1) break;
                  yin_print_extension_instances
                            (local_40,iVar6,local_50,LYEXT_SUBSTMT_BELONGSTO,(uint8_t)lVar25,
                             pplVar21[uVar14]->ext + iVar8,1);
                }
                yin_print_substmt(local_40,iVar6,LYEXT_SUBSTMT_PREFIX,(uint8_t)lVar25,
                                  *(char **)(local_70[1] + lVar25 * 8),local_50,
                                  pplVar21[uVar14]->ext,(uint)pplVar21[uVar14]->ext_size);
                yin_print_close(plVar19,local_34,(char *)0x0,"belongs-to",1);
                lVar25 = lVar25 + 1;
                lVar15 = *plVar12;
              }
            }
            break;
          case LYEXT_SUBSTMT_VALUE:
            plVar13 = pplStack_58[local_48];
            uVar4 = *(undefined8 *)(puVar26 + 8);
            lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
            if (lVar15 != 0) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                iVar8 = 0x182f06;
                yin_print_close_parent(local_40,&local_38);
                yin_print_signed(plVar19,local_34,LYEXT_SUBSTMT_SELF,(uint8_t)local_50,
                                 (lys_module *)pplStack_58[local_48]->ext,
                                 (lys_ext_instance **)(ulong)pplStack_58[local_48]->ext_size,
                                 **(uint **)((long)&plVar13[1].parent + uVar4),iVar8);
              }
              else {
                lVar25 = 0;
                while (plVar19 = local_40, *(long *)(lVar15 + lVar25 * 8) != 0) {
                  iVar8 = 0x1823d1;
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_signed(plVar19,local_34,(LYEXT_SUBSTMT)lVar25 & 0xff,(uint8_t)local_50,
                                   (lys_module *)pplStack_58[local_48]->ext,
                                   (lys_ext_instance **)(ulong)pplStack_58[local_48]->ext_size,
                                   **(uint **)(*(long *)((long)&plVar13[1].parent + uVar4) +
                                              lVar25 * 8),iVar8);
                  lVar25 = lVar25 + 1;
                  lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
                }
              }
            }
            break;
          case LYEXT_SUBSTMT_VERSION:
          case LYEXT_SUBSTMT_YINELEM:
            break;
          case LYEXT_SUBSTMT_MODIFIER:
            plVar17 = (lys_ext_instance_complex *)pplStack_58[local_48];
            pcVar22 = "invert-match";
            LVar9 = LY_STMT_MODIFIER;
            pcVar23 = (char *)0x0;
            goto LAB_0018284c;
          case LYEXT_SUBSTMT_REQINSTANCE:
            plVar17 = (lys_ext_instance_complex *)pplStack_58[local_48];
            pcVar22 = "true";
            LVar9 = LY_STMT_REQINSTANCE;
            pcVar23 = "false";
LAB_0018284c:
            yin_print_extcomplex_bool
                      (local_40,local_34,local_50,plVar17,LVar9,pcVar22,pcVar23,&local_38);
            break;
          case LYEXT_SUBSTMT_CONFIG:
            plVar17 = (lys_ext_instance_complex *)pplStack_58[local_48];
            pcVar22 = "false";
            pcVar23 = "true";
            LVar9 = LY_STMT_CONFIG;
            val2 = 6;
            val1 = 5;
            goto LAB_00182984;
          case LYEXT_SUBSTMT_MANDATORY:
            plVar17 = (lys_ext_instance_complex *)pplStack_58[local_48];
            pcVar22 = "true";
            pcVar23 = "false";
            LVar9 = LY_STMT_MANDATORY;
            val2 = 0x40;
            val1 = 0x80;
            goto LAB_00182984;
          case LYEXT_SUBSTMT_ORDEREDBY:
            plVar17 = (lys_ext_instance_complex *)pplStack_58[local_48];
            pcVar22 = "user";
            pcVar23 = "system";
            LVar9 = LY_STMT_ORDEREDBY;
            val2 = 0x100;
            val1 = 0;
LAB_00182984:
            yin_print_extcomplex_flags
                      (local_40,local_34,local_50,plVar17,LVar9,pcVar23,pcVar22,val1,val2,&local_38)
            ;
            break;
          case LYEXT_SUBSTMT_STATUS:
            uVar2 = *(ushort *)
                     ((long)&pplStack_58[local_48][1].parent + *(undefined8 *)(puVar26 + 8));
            if (uVar2 != 0) {
              if ((uVar2 & 8) == 0) {
                if ((uVar2 & 0x10) == 0) {
                  if ((uVar2 & 0x20) == 0) break;
                  pcVar22 = "obsolete";
                }
                else {
                  pcVar22 = "deprecated";
                }
              }
              else {
                pcVar22 = "current";
              }
              yin_print_close_parent(local_40,&local_38);
              bVar1 = pplVar21[local_48]->ext_size;
              LVar18 = LYEXT_SUBSTMT_STATUS;
              pplVar21 = pplVar21[local_48]->ext;
LAB_00182105:
              yin_print_substmt(plVar19,local_34,LVar18,'\0',pcVar22,local_50,pplVar21,(uint)bVar1);
            }
            break;
          case LYEXT_SUBSTMT_DIGITS:
            plVar13 = pplStack_58[local_48];
            uVar4 = *(undefined8 *)(puVar26 + 8);
            if (*(uint *)&local_78->ref < 2) {
              uVar14 = (ulong)*(byte *)((long)&plVar13[1].parent + uVar4);
            }
            else {
              uVar14 = *(ulong *)((long)&plVar13[1].parent + uVar4);
              if (uVar14 != 0) {
                lVar15 = 0;
                while (plVar19 = local_40, *(char *)(uVar14 + lVar15) != '\0') {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_unsigned(plVar19,local_34,LYEXT_SUBSTMT_DIGITS,(uint8_t)lVar15,local_50,
                                     pplStack_58[local_48]->ext,
                                     (uint)pplStack_58[local_48]->ext_size,
                                     (uint)*(byte *)(*(long *)((long)&plVar13[1].parent + uVar4) +
                                                    lVar15));
                  lVar15 = lVar15 + 1;
                  uVar14 = *(ulong *)((long)&plVar13[1].parent + uVar4);
                }
                break;
              }
            }
            if ((char)uVar14 != '\0') {
              yin_print_close_parent(local_40,&local_38);
              pplVar21 = pplStack_58[local_48]->ext;
              ext_size = (uint)pplStack_58[local_48]->ext_size;
              uVar24 = (uint)*(byte *)((long)&plVar13[1].parent + uVar4);
              LVar18 = LYEXT_SUBSTMT_DIGITS;
LAB_00182fa4:
              yin_print_unsigned(plVar19,local_34,LVar18,'\0',local_50,pplVar21,ext_size,uVar24);
            }
            break;
          case LYEXT_SUBSTMT_MAX:
            plVar13 = pplStack_58[local_48];
            uVar4 = *(undefined8 *)(puVar26 + 8);
            lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
            if (lVar15 != 0) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                pplVar21 = pplStack_58[local_48]->ext;
                ext_size = (uint)pplStack_58[local_48]->ext_size;
                uVar24 = **(uint **)((long)&plVar13[1].parent + uVar4);
                LVar18 = LYEXT_SUBSTMT_MAX;
                goto LAB_00182fa4;
              }
              lVar25 = 0;
              while (plVar19 = local_40, *(long *)(lVar15 + lVar25 * 8) != 0) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_unsigned(plVar19,local_34,LYEXT_SUBSTMT_MAX,(uint8_t)lVar25,local_50,
                                   pplStack_58[local_48]->ext,(uint)pplStack_58[local_48]->ext_size,
                                   **(uint **)(*(long *)((long)&plVar13[1].parent + uVar4) +
                                              lVar25 * 8));
                lVar25 = lVar25 + 1;
                lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
              }
            }
            break;
          case LYEXT_SUBSTMT_MIN:
            plVar13 = pplStack_58[local_48];
            uVar4 = *(undefined8 *)(puVar26 + 8);
            lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
            if (lVar15 != 0) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                pplVar21 = pplStack_58[local_48]->ext;
                ext_size = (uint)pplStack_58[local_48]->ext_size;
                uVar24 = **(uint **)((long)&plVar13[1].parent + uVar4);
                LVar18 = LYEXT_SUBSTMT_MIN;
                goto LAB_00182fa4;
              }
              lVar25 = 0;
              while (plVar19 = local_40, *(long *)(lVar15 + lVar25 * 8) != 0) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_unsigned(plVar19,local_34,LYEXT_SUBSTMT_MIN,(uint8_t)lVar25,local_50,
                                   pplStack_58[local_48]->ext,(uint)pplStack_58[local_48]->ext_size,
                                   **(uint **)(*(long *)((long)&plVar13[1].parent + uVar4) +
                                              lVar25 * 8));
                lVar25 = lVar25 + 1;
                lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
              }
            }
            break;
          case LYEXT_SUBSTMT_POSITION:
            plVar13 = pplStack_58[local_48];
            uVar4 = *(undefined8 *)(puVar26 + 8);
            lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
            if (lVar15 != 0) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                pplVar21 = pplStack_58[local_48]->ext;
                ext_size = (uint)pplStack_58[local_48]->ext_size;
                uVar24 = **(uint **)((long)&plVar13[1].parent + uVar4);
                LVar18 = LYEXT_SUBSTMT_POSITION;
                goto LAB_00182fa4;
              }
              lVar25 = 0;
              while (plVar19 = local_40, *(long *)(lVar15 + lVar25 * 8) != 0) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_unsigned(plVar19,local_34,LYEXT_SUBSTMT_POSITION,(uint8_t)lVar25,local_50,
                                   pplStack_58[local_48]->ext,(uint)pplStack_58[local_48]->ext_size,
                                   **(uint **)(*(long *)((long)&plVar13[1].parent + uVar4) +
                                              lVar25 * 8));
                lVar25 = lVar25 + 1;
                lVar15 = *(long *)((long)&plVar13[1].parent + uVar4);
              }
            }
            break;
          case LYEXT_SUBSTMT_UNIQUE:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_UNIQUE,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                iVar8 = -1;
                yin_print_close_parent(local_40,&local_38);
                yin_print_unique(plVar19,local_34,local_50,(lys_unique *)*plVar12);
                uVar14 = local_48;
                pplVar21 = pplStack_58;
                local_5c = 0;
                while (plVar13 = pplVar21[uVar14],
                      iVar8 = lys_ext_iter(plVar13->ext,plVar13->ext_size,(char)iVar8 + '\x01',
                                           LYEXT_SUBSTMT_UNIQUE), iVar8 != -1) {
                  yin_print_close_parent(plVar19,&local_5c);
                  yin_print_extension_instances
                            (plVar19,local_60,local_50,LYEXT_SUBSTMT_UNIQUE,'\0',
                             pplVar21[uVar14]->ext + iVar8,1);
                }
                pcVar22 = "unique";
                iVar8 = local_5c;
                goto LAB_00183359;
              }
              uVar24 = 0;
              for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_unique(plVar19,local_34,local_50,(lys_unique *)*plVar16);
                pplVar7 = pplStack_58;
                local_5c = 0;
                plVar13 = pplStack_58[local_48];
                pplVar21 = plVar13->ext;
                iVar8 = -1;
                while (iVar8 = lys_ext_iter(pplVar21,plVar13->ext_size,(char)iVar8 + '\x01',
                                            LYEXT_SUBSTMT_UNIQUE), iVar8 != -1) {
                  plVar13 = pplVar7[local_48];
                  pplVar21 = plVar13->ext;
                  if (uVar24 == pplVar21[iVar8]->insubstmt_index) {
                    yin_print_close_parent(local_40,&local_5c);
                    pplVar21 = pplVar7[local_48]->ext;
                    do {
                      yin_print_extension_instances
                                (local_40,local_60,local_50,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar24,
                                 pplVar21 + iVar8,1);
                      plVar13 = pplVar7[local_48];
                      pplVar21 = plVar13->ext;
                      do {
                        iVar8 = lys_ext_iter(pplVar21,plVar13->ext_size,(char)iVar8 + '\x01',
                                             LYEXT_SUBSTMT_UNIQUE);
                        if (iVar8 == -1) goto LAB_00182d1c;
                        plVar13 = pplVar7[local_48];
                        pplVar21 = plVar13->ext;
                      } while (uVar24 != pplVar21[iVar8]->insubstmt_index);
                    } while( true );
                  }
                }
LAB_00182d1c:
                yin_print_close(local_40,local_34,(char *)0x0,"unique",local_5c);
                uVar24 = uVar24 + 1;
              }
            }
            break;
          case 0x20:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_MODULE,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_model_(plVar19,local_34,(lys_module *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_model_(plVar19,local_34,(lys_module *)*plVar16);
                }
              }
            }
            break;
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
          case 0x26:
          case 0x27:
          case 0x28:
          case 0x29:
          case 0x2a:
          case 0x2b:
          case 0x2c:
          case 0x2d:
          case 0x2e:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LVar18,(lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            if ((plVar12 != (long *)0x0) && (node = (lys_node *)*plVar12, node != (lys_node *)0x0))
            {
              for (; node != (lys_node *)0x0; node = node->next) {
                LVar9 = lys_snode2stmt(node->nodetype);
                plVar19 = local_40;
                if (LVar9 == *(LY_STMT *)puVar26) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_snode(plVar19,local_34,node,0xffff);
                }
              }
            }
            break;
          case 0x2f:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_TYPEDEF,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_typedef(plVar19,local_34,local_50,(lys_tpdf *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_typedef(plVar19,local_34,local_50,(lys_tpdf *)*plVar16);
                }
              }
            }
            break;
          case 0x30:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_TYPE,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_type(plVar19,local_34,local_50,(lys_type *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_type(plVar19,local_34,local_50,(lys_type *)*plVar16);
                }
              }
            }
            break;
          case 0x31:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_IFFEATURE,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_iffeature(plVar19,local_34,local_50,(lys_iffeature *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_iffeature(plVar19,local_34,local_50,(lys_iffeature *)*plVar16);
                }
              }
            }
            break;
          case 0x32:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_LENGTH,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                restr = (lys_restr *)*plVar12;
                pcVar22 = "length";
LAB_00183382:
                yin_print_typerestr(plVar19,local_34,local_50,restr,pcVar22);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_typerestr(plVar19,local_34,local_50,(lys_restr *)*plVar16,"length");
                }
              }
            }
            break;
          case 0x33:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_MUST,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_must(plVar19,local_34,local_50,(lys_restr *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_must(plVar19,local_34,local_50,(lys_restr *)*plVar16);
                }
              }
            }
            break;
          case 0x34:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_PATTERN,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                restr = (lys_restr *)*plVar12;
                pcVar22 = "pattern";
                goto LAB_00183382;
              }
              for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_typerestr(plVar19,local_34,local_50,(lys_restr *)*plVar16,"pattern");
              }
            }
            break;
          case 0x35:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_RANGE,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                restr = (lys_restr *)*plVar12;
                pcVar22 = "range";
                goto LAB_00183382;
              }
              for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_typerestr(plVar19,local_34,local_50,(lys_restr *)*plVar16,"range");
              }
            }
            break;
          case 0x36:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_WHEN,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_when(plVar19,local_34,local_50,(lys_when *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_when(plVar19,local_34,local_50,(lys_when *)*plVar16);
                }
              }
            }
            break;
          case 0x37:
            plVar12 = (long *)lys_ext_complex_get_substmt
                                        (LY_STMT_REVISION,
                                         (lys_ext_instance_complex *)pplStack_58[local_48],
                                         (lyext_substmt **)0x0);
            plVar19 = local_40;
            if ((plVar12 != (long *)0x0) && (plVar16 = (long *)*plVar12, plVar16 != (long *)0x0)) {
              if ((uint)*(LY_STMT *)(puVar26 + 0x10) < 2) {
                yin_print_close_parent(local_40,&local_38);
                yin_print_revision(plVar19,local_34,local_50,(lys_revision *)*plVar12);
              }
              else {
                for (; plVar19 = local_40, *plVar16 != 0; plVar16 = plVar16 + 1) {
                  yin_print_close_parent(local_40,&local_38);
                  yin_print_revision(plVar19,local_34,local_50,(lys_revision *)*plVar16);
                }
              }
            }
          }
switchD_00181fd8_caseD_13:
          local_b0 = local_b0 + 1;
        } while( true );
      }
    }
    else {
      uVar14 = (ulong)local_64;
    }
    goto LAB_00183448;
  }
  goto LAB_00183465;
switchD_00181fd8_caseD_0:
  plVar13 = pplStack_58[local_48];
  uVar14 = (ulong)local_64;
  ext = pplStack_58;
  pcVar22 = local_a0;
  substmt = local_8c;
LAB_00183448:
  yin_print_close(local_40,(int)local_80,pcVar22,plVar13->def->name,local_38);
LAB_00183465:
  local_48 = local_48 + 1;
  goto LAB_00181d15;
}

Assistant:

static void
yin_print_extension_instances(struct lyout *out, int level, const struct lys_module *module,
                              LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                              struct lys_ext_instance **ext, unsigned int count)
{
    unsigned int u, x;
    struct lys_module *mod;
    const char *prefix = NULL;
    struct lyext_substmt *info;
    int content, content2, i, j, c;
    uint16_t *flags;
    const char *str;
    void **pp, *p;
    struct lys_node *siter;

#define YIN_PRINT_EXTCOMPLEX_SNODE(STMT)                                                      \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    LY_TREE_FOR((struct lys_node*)(*pp), siter) {                                             \
        if (lys_snode2stmt(siter->nodetype) == STMT) {                                        \
            yin_print_close_parent(out, &content);                                            \
            yin_print_snode(out, level, siter, LYS_ANY);                                      \
        }                                                                                     \
    }
#define YIN_PRINT_EXTCOMPLEX_STRUCT(STMT, TYPE, FUNC)                                         \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    if (info[i].cardinality >= LY_STMT_CARD_SOME) { /* process array */                       \
        for (pp = *pp; *pp; pp++) {                                                           \
            yin_print_close_parent(out, &content);                                            \
            FUNC(out, level, (TYPE *)(*pp));                                                  \
        }                                                                                     \
    }